

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O2

void __thiscall
StunMsgEncode_RFC5769SampleIPv6Response_Test::TestBody
          (StunMsgEncode_RFC5769SampleIPv6Response_Test *this)

{
  sockaddr_in6 *psVar1;
  uint16_t uVar2;
  int iVar3;
  stun_msg_hdr *psVar4;
  sockaddr_in6 *this_00;
  AssertionResult *this_01;
  char *pcVar5;
  char *in_R9;
  bool bVar6;
  self_type sVar7;
  AssertionResult gtest_ar__3;
  msgint local_108;
  AssertHelper local_f0;
  AssertionResult gtest_ar;
  iterator i;
  sockaddr_in6 test_addr;
  message message;
  char software_name [12];
  char password [23];
  uint8_t tsx_id [12];
  sockaddr_in6 ipv6;
  
  this_01 = &gtest_ar__3;
  builtin_strncpy(software_name,"test vector",0xc);
  builtin_strncpy(password,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  tsx_id[0] = 0xb7;
  tsx_id[1] = 0xe7;
  tsx_id[2] = 0xa7;
  tsx_id[3] = '\x01';
  tsx_id[4] = 0xbc;
  tsx_id[5] = '4';
  tsx_id[6] = 0xd6;
  tsx_id[7] = 0x86;
  tsx_id[8] = 0xfa;
  tsx_id[9] = 0x87;
  tsx_id[10] = 0xdf;
  tsx_id[0xb] = 0xae;
  ipv6.sin6_family = 10;
  ipv6.sin6_port = 0x5580;
  inet_pton(10,"2001:db8:1234:5678:11:2233:4455:6677",&ipv6.sin6_addr);
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)&message,0x101,tsx_id);
  strlen(software_name);
  gtest_ar._0_2_ = 0x8022;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)software_name;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&message,(varsize<char> *)&gtest_ar);
  test_addr.sin6_family = 0x20;
  test_addr.sin6_addr.__in6_u._0_8_ = &ipv6;
  stun::base_message<std::allocator<unsigned_char>_>::
  push_back<stun::attribute::bits::xor_socket_address>(&message,(xor_socket_address *)&test_addr);
  i.attr_ = (decoded)stun::attribute::message_integrity(password);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&message,(msgint *)&i);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::fingerprint>
            (&message,(fingerprint *)&gtest_ar__3);
  test_addr.sin6_family = 0x5c;
  test_addr.sin6_port = 0;
  test_addr.sin6_flowinfo = 0;
  psVar4 = (stun_msg_hdr *)
           stun_msg_len((stun_msg_hdr *)
                        message.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  i.attr_.msg_hdr_ = psVar4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof(expected_result)","message.size()",
             (unsigned_long *)&test_addr,(unsigned_long *)&i);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x13f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,(Message *)&test_addr);
    psVar1 = (sockaddr_in6 *)&gtest_ar;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    this_00 = &test_addr;
LAB_0012d593:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
    goto LAB_0012dca7;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  anon_unknown.dwarf_19b63::IsEqual
            ((anon_unknown_dwarf_19b63 *)&test_addr,&DAT_00147410,
             message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,0x5c);
  if ((char)test_addr.sin6_family == '\0') {
    testing::Message::Message((Message *)&i);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&test_addr,
               (AssertionResult *)
               "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x141,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&i);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&test_addr.sin6_addr);
  test_addr.sin6_family = 0x101;
  test_addr.sin6_port = 0;
  uVar2 = stun_msg_type((stun_msg_hdr *)
                        message.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  i.attr_.msg_hdr_._0_2_ = uVar2;
  testing::internal::
  CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
            ((internal *)&gtest_ar,"stun::message::binding_response","message.type()",
             (type *)&test_addr,(unsigned_short *)&i);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x145,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,(Message *)&test_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&test_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  i = stun::base_message<std::allocator<unsigned_char>_>::begin(&message);
  test_addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
  test_addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
  bVar6 = i.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
  test_addr.sin6_family._0_1_ = !bVar6;
  if (bVar6) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&test_addr,(AssertionResult *)"message.end() != i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x148,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3);
LAB_0012d53a:
    psVar1 = &test_addr;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar);
LAB_0012dc9f:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_01);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&test_addr.sin6_addr);
    test_addr.sin6_family = 0x8022;
    test_addr.sin6_port = 0;
    uVar2 = stun_attr_type(i.attr_.attr_hdr_);
    gtest_ar__3._0_2_ = uVar2;
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)&gtest_ar,"type::software","i->type()",(attribute_type *)&test_addr,
               (unsigned_short *)&gtest_ar__3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&test_addr);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x149,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&test_addr)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&test_addr);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar__3._0_8_ = i.attr_.msg_hdr_;
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i.attr_.attr_hdr_;
    stun::attribute::decoding_bits::string::to_string_abi_cxx11_
              ((string *)&gtest_ar,(string *)&gtest_ar__3);
    testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
              ((internal *)&test_addr,"software_name","i->to<type::software>().to_string()",
               &software_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((char)test_addr.sin6_family == '\0') {
      testing::Message::Message((Message *)&gtest_ar);
      if ((undefined8 *)
          CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                   test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                    test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x14b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar);
      psVar1 = &test_addr;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      this_00 = (sockaddr_in6 *)&gtest_ar;
      goto LAB_0012d593;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&test_addr.sin6_addr);
    sVar7 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
    test_addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
    test_addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
    bVar6 = sVar7.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    test_addr.sin6_family._0_1_ = !bVar6;
    if (bVar6) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&test_addr,
                 (AssertionResult *)"message.end() != ++i","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x14d,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3)
      ;
      goto LAB_0012d53a;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&test_addr.sin6_addr);
    test_addr.sin6_family = 0x20;
    test_addr.sin6_port = 0;
    uVar2 = stun_attr_type(i.attr_.attr_hdr_);
    gtest_ar__3._0_2_ = uVar2;
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)&gtest_ar,"type::xor_mapped_address","i->type()",
               (attribute_type *)&test_addr,(unsigned_short *)&gtest_ar__3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&test_addr);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x14e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&test_addr)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&test_addr);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    test_addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
    test_addr._20_8_ = 0;
    test_addr.sin6_family = 0;
    test_addr.sin6_port = 0;
    test_addr.sin6_flowinfo = 0;
    test_addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
    test_addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
    gtest_ar._0_8_ = i.attr_.msg_hdr_;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i.attr_.attr_hdr_;
    bVar6 = stun::attribute::decoding_bits::xor_socket_address::to_sockaddr
                      ((xor_socket_address *)&gtest_ar,(sockaddr *)&test_addr);
    gtest_ar__3.success_ = bVar6;
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar6) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                 (AssertionResult *)
                 "i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x152,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_108);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__3.message_);
    gtest_ar__3._0_4_ = 10;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)&gtest_ar,"10","test_addr.sin6_family",(int *)&gtest_ar__3,
               &test_addr.sin6_family);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x153,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar__3._0_2_ = 0x5580;
    testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
              ((internal *)&gtest_ar,"__bswap_16 (32853)","test_addr.sin6_port",
               (unsigned_short *)&gtest_ar__3,&test_addr.sin6_port);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x154,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
    iVar3 = memcmp(&test_addr.sin6_addr,&ipv6.sin6_addr,0x10);
    local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_ =
         (stun_msg_hdr *)
         CONCAT44(local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_._4_4_,iVar3);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0",
               "memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr, sizeof(ipv6.sin6_addr))",
               (int *)&gtest_ar__3,(int *)&local_108);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x156,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    sVar7 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar6 = sVar7.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    gtest_ar__3.success_ = !bVar6;
    if (bVar6) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                 (AssertionResult *)"message.end() != ++i","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x158,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
LAB_0012dc86:
      psVar1 = (sockaddr_in6 *)&gtest_ar__3;
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      this_01 = (AssertionResult *)&local_108;
      goto LAB_0012dc9f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__3.message_);
    gtest_ar__3._0_4_ = 8;
    uVar2 = stun_attr_type(i.attr_.attr_hdr_);
    local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_ =
         (stun_msg_hdr *)
         CONCAT62(local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_._2_6_,uVar2);
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)&gtest_ar,"type::message_integrity","i->type()",
               (attribute_type *)&gtest_ar__3,(unsigned_short *)&local_108);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x159,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_ = i.attr_.msg_hdr_;
    local_108.super_attribute_base<_stun_attr_msgint>.attr_ = (_stun_attr_msgint *)i.attr_.attr_hdr_
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,password,(allocator<char> *)&local_f0);
    bVar6 = stun::attribute::decoding_bits::msgint::check_integrity(&local_108,(string *)&gtest_ar);
    gtest_ar__3.success_ = bVar6;
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar__3.success_ == false) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                 (AssertionResult *)"i->to<type::message_integrity>().check_integrity(password)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x15b,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_108);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__3.message_);
    sVar7 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar6 = sVar7.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    gtest_ar__3.success_ = !bVar6;
    if (bVar6) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                 (AssertionResult *)"message.end() != ++i","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x15d,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
      goto LAB_0012dc86;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__3.message_);
    gtest_ar__3._0_4_ = 0x8028;
    uVar2 = stun_attr_type(i.attr_.attr_hdr_);
    local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_ =
         (stun_msg_hdr *)
         CONCAT62(local_108.super_attribute_base<_stun_attr_msgint>.msg_hdr_._2_6_,uVar2);
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)&gtest_ar,"type::fingerprint","i->type()",(attribute_type *)&gtest_ar__3,
               (unsigned_short *)&local_108);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x15e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar._0_8_ = i.attr_.msg_hdr_;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i.attr_.attr_hdr_;
    bVar6 = stun::attribute::decoding_bits::fingerprint::check_integrity((fingerprint *)&gtest_ar);
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__3.success_ = bVar6;
    if (!bVar6) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                 (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x160,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_108);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__3.message_);
    sVar7 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
    psVar1 = (sockaddr_in6 *)&gtest_ar__3;
    gtest_ar__3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__3.success_ = sVar7.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    if (!gtest_ar__3.success_) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                 (AssertionResult *)"message.end() == ++i","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x162,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_108);
      goto LAB_0012dc86;
    }
  }
LAB_0012dca7:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&psVar1->sin6_addr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&message);
  return;
}

Assistant:

TEST(StunMsgEncode, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv6)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}